

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSubmitHandler.cxx
# Opt level: O2

void __thiscall cmCTestSubmitHandler::ResponseParser::EndElement(ResponseParser *this,string *name)

{
  bool bVar1;
  string *this_00;
  string status;
  string local_50;
  string local_30;
  
  bVar1 = std::operator==(name,"status");
  if (bVar1) {
    GetCurrentValue_abi_cxx11_(&local_30,this);
    cmsys::SystemTools::UpperCase(&local_50,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    bVar1 = std::operator==(&local_50,"OK");
    if ((bVar1) || (bVar1 = std::operator==(&local_50,"SUCCESS"), bVar1)) {
      this->Status = STATUS_OK;
    }
    else {
      bVar1 = std::operator==(&local_50,"WARNING");
      if (bVar1) {
        this->Status = STATUS_WARNING;
      }
      else {
        this->Status = STATUS_ERROR;
      }
    }
  }
  else {
    bVar1 = std::operator==(name,"filename");
    if (bVar1) {
      GetCurrentValue_abi_cxx11_(&local_50,this);
      this_00 = (string *)&this->Filename;
    }
    else {
      bVar1 = std::operator==(name,"md5");
      if (bVar1) {
        GetCurrentValue_abi_cxx11_(&local_50,this);
        this_00 = (string *)&this->MD5;
      }
      else {
        bVar1 = std::operator==(name,"message");
        if (bVar1) {
          GetCurrentValue_abi_cxx11_(&local_50,this);
          this_00 = (string *)&this->Message;
        }
        else {
          bVar1 = std::operator==(name,"buildId");
          if (!bVar1) {
            return;
          }
          GetCurrentValue_abi_cxx11_(&local_50,this);
          this_00 = (string *)&this->BuildID;
        }
      }
    }
    std::__cxx11::string::operator=(this_00,(string *)&local_50);
  }
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void EndElement(const std::string& name) override
  {
    if (name == "status") {
      std::string status = cmSystemTools::UpperCase(this->GetCurrentValue());
      if (status == "OK" || status == "SUCCESS") {
        this->Status = STATUS_OK;
      } else if (status == "WARNING") {
        this->Status = STATUS_WARNING;
      } else {
        this->Status = STATUS_ERROR;
      }
    } else if (name == "filename") {
      this->Filename = this->GetCurrentValue();
    } else if (name == "md5") {
      this->MD5 = this->GetCurrentValue();
    } else if (name == "message") {
      this->Message = this->GetCurrentValue();
    } else if (name == "buildId") {
      this->BuildID = this->GetCurrentValue();
    }
  }